

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O1

Abc_Obj_t * Abc_NtkFindCi(Abc_Ntk_t *pNtk,char *pName)

{
  uint uVar1;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x21c,"Abc_Obj_t *Abc_NtkFindCi(Abc_Ntk_t *, char *)");
  }
  uVar1 = Nm_ManFindIdByName(pNtk->pManName,pName,2);
  if (((int)uVar1 < 0) && (uVar1 = Nm_ManFindIdByName(pNtk->pManName,pName,5), (int)uVar1 < 0)) {
    return (Abc_Obj_t *)0x0;
  }
  if ((int)uVar1 < pNtk->vObjs->nSize) {
    return (Abc_Obj_t *)pNtk->vObjs->pArray[uVar1];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NtkFindCi( Abc_Ntk_t * pNtk, char * pName )
{
    int Num;
    assert( !Abc_NtkIsNetlist(pNtk) );
    Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_PI );
    if ( Num >= 0 )
        return Abc_NtkObj( pNtk, Num );
    Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_BO );
    if ( Num >= 0 )
        return Abc_NtkObj( pNtk, Num );
    return NULL;
}